

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleDifferentCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *this_00;
  cmCommand *this_01;
  pointer __s;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *value;
  uint uVar5;
  pointer pbVar6;
  pointer __s_00;
  int iVar7;
  ulong uVar8;
  ostringstream e;
  pointer local_1e0;
  string local_1d8;
  cmCommand *local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6)) {
    iVar7 = 1;
    uVar8 = 1;
    uVar5 = 2;
    local_1e0 = (pointer)0x0;
    local_1b0 = (pointer)0x0;
    __s_00 = (char *)0x0;
    local_1b8 = &this->super_cmCommand;
    do {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar6 + uVar8));
      this_01 = local_1b8;
      if (iVar3 == 0) {
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar7 = 2;
      }
      else {
        if (iVar7 == 3) {
          pbVar6 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_1b0 = pbVar6[uVar8]._M_dataplus._M_p;
        }
        else {
          if (iVar7 == 2) {
            pbVar6 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            __s_00 = pbVar6[uVar8]._M_dataplus._M_p;
            iVar7 = 3;
            goto LAB_002fa481;
          }
          if (iVar7 != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"DIFFERENT given unknown argument ",0x21);
            pbVar6 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pbVar6[uVar8]._M_dataplus._M_p,
                       pbVar6[uVar8]._M_string_length);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1b8,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            return false;
          }
          pbVar6 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_1e0 = pbVar6[uVar8]._M_dataplus._M_p;
        }
        iVar7 = 0;
      }
LAB_002fa481:
      __s = local_1b0;
      uVar8 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar8 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
    ;
    this = (cmFileCommand *)local_1b8;
    if (local_1e0 != (char *)0x0) {
      if (__s_00 != (char *)0x0 && local_1b0 != (char *)0x0) {
        pcVar1 = local_1a8 + 0x10;
        local_1a8._0_8_ = pcVar1;
        sVar4 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s_00,__s_00 + sVar4);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        sVar4 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,__s,__s + sVar4);
        bVar2 = cmsys::SystemTools::FilesDiffer((string *)local_1a8,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        this_00 = this_01->Makefile;
        local_1a8._0_8_ = pcVar1;
        sVar4 = strlen(local_1e0);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,local_1e0,local_1e0 + sVar4);
        value = "0";
        if (bVar2) {
          value = "1";
        }
        cmMakefile::AddDefinition(this_00,(string *)local_1a8,value);
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        return true;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"DIFFERENT not given FILES option with two file names.","");
      cmCommand::SetError(this_01,(string *)local_1a8);
      goto LAB_002fa5d8;
    }
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"DIFFERENT not given result variable name.","");
  cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_002fa5d8:
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool
cmFileCommand::HandleDifferentCommand(std::vector<std::string> const& args)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = 0;
  const char* file_rhs = 0;
  const char* var = 0;
  enum Doing { DoingNone, DoingVar, DoingFileLHS, DoingFileRHS };
  Doing doing = DoingVar;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "FILES")
      {
      doing = DoingFileLHS;
      }
    else if(doing == DoingVar)
      {
      var = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingFileLHS)
      {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
      }
    else if(doing == DoingFileRHS)
      {
      file_rhs = args[i].c_str();
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "DIFFERENT given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }
  if(!var)
    {
    this->SetError("DIFFERENT not given result variable name.");
    return false;
    }
  if(!file_lhs || !file_rhs)
    {
    this->SetError("DIFFERENT not given FILES option with two file names.");
    return false;
    }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs)? "1" : "0";
  this->Makefile->AddDefinition(var, result);
  return true;
}